

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystem::handleDiagnostic
          (CAPIBuildSystem *this,SMDiagnostic *diagnostic)

{
  _func_void_void_ptr_llb_buildsystem_diagnostic_kind_t_char_ptr_int_int_char_ptr *p_Var1;
  void *pvVar2;
  llb_buildsystem_diagnostic_kind_t lVar3;
  DiagKind DVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  StringRef local_80;
  string local_70;
  StringRef local_50;
  string local_40;
  llb_buildsystem_diagnostic_kind_t local_1c;
  SMDiagnostic *pSStack_18;
  llb_buildsystem_diagnostic_kind_t kind;
  SMDiagnostic *diagnostic_local;
  CAPIBuildSystem *this_local;
  
  local_1c = llb_buildsystem_diagnostic_kind_note;
  pSStack_18 = diagnostic;
  diagnostic_local = (SMDiagnostic *)this;
  DVar4 = llvm::SMDiagnostic::getKind(diagnostic);
  if (DVar4 == DK_Error) {
    local_1c = llb_buildsystem_diagnostic_kind_error;
  }
  else if (DVar4 == DK_Warning) {
    local_1c = llb_buildsystem_diagnostic_kind_warning;
  }
  else if (DVar4 - DK_Remark < 2) {
    local_1c = llb_buildsystem_diagnostic_kind_note;
  }
  lVar3 = local_1c;
  p_Var1 = (this->cAPIDelegate).handle_diagnostic;
  pvVar2 = (this->cAPIDelegate).context;
  local_50 = llvm::SMDiagnostic::getFilename(pSStack_18);
  llvm::StringRef::str_abi_cxx11_(&local_40,&local_50);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  iVar5 = llvm::SMDiagnostic::getLineNo(pSStack_18);
  iVar6 = llvm::SMDiagnostic::getColumnNo(pSStack_18);
  local_80 = llvm::SMDiagnostic::getMessage(pSStack_18);
  llvm::StringRef::str_abi_cxx11_(&local_70,&local_80);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  (*p_Var1)(pvVar2,lVar3,pcVar7,iVar5,iVar6,pcVar8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void handleDiagnostic(const llvm::SMDiagnostic& diagnostic) {
    llb_buildsystem_diagnostic_kind_t kind = llb_buildsystem_diagnostic_kind_note;
    switch (diagnostic.getKind()) {
    case llvm::SourceMgr::DK_Error:
      kind = llb_buildsystem_diagnostic_kind_error;
      break;
    case llvm::SourceMgr::DK_Warning:
      kind = llb_buildsystem_diagnostic_kind_warning;
      break;
    case llvm::SourceMgr::DK_Note:
    case llvm::SourceMgr::DK_Remark:
      kind = llb_buildsystem_diagnostic_kind_note;
      break;
    }

    // FIXME: We don't currently expose the caret diagnostic information, or
    // fixits. llbuild does currently make use of the caret diagnostics for
    // reporting problems in build manifest files...
    cAPIDelegate.handle_diagnostic(
        cAPIDelegate.context, kind,
        diagnostic.getFilename().str().c_str(),
        diagnostic.getLineNo(), diagnostic.getColumnNo(),
        diagnostic.getMessage().str().c_str());
  }